

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  allocator local_541;
  string local_540 [32];
  Mat local_520 [96];
  Mat local_4c0 [96];
  float local_460;
  allocator local_459;
  float loss_threshold;
  allocator local_431;
  string local_430 [36];
  int local_40c;
  Mat local_408 [4];
  int sample_number;
  Mat test_label;
  Mat local_3a8 [8];
  Mat test_input;
  Mat local_348 [8];
  Mat label;
  Mat local_2e8 [8];
  Mat input;
  Scalar_<double> local_288;
  vector<int,_std::allocator<int>_> local_268;
  undefined1 local_250 [8];
  Net net;
  allocator<int> local_4d;
  int local_4c [3];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> layer_neuron_num;
  char **argv_local;
  int argc_local;
  
  local_4c[0] = 0x310;
  local_4c[1] = 100;
  local_4c[2] = 10;
  local_40 = local_4c;
  local_38 = 3;
  layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  std::allocator<int>::allocator(&local_4d);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  liu::Net::Net((Net *)local_250);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_268,(vector<int,_std::allocator<int>_> *)local_30);
  liu::Net::initNet((Net *)local_250,&local_268);
  std::vector<int,_std::allocator<int>_>::~vector(&local_268);
  liu::Net::initWeights((Net *)local_250,0,0.0,0.01);
  cv::Scalar_<double>::Scalar_(&local_288,0.05);
  liu::Net::initBias((Net *)local_250,&local_288);
  cv::Mat::Mat(local_2e8);
  cv::Mat::Mat(local_348);
  cv::Mat::Mat(local_3a8);
  cv::Mat::Mat(local_408);
  local_40c = 200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"data/input_label_1000.xml",&local_431);
  liu::get_input_label((string *)local_430,local_2e8,local_348,local_40c,0);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&loss_threshold,"data/input_label_1000.xml",&local_459);
  liu::get_input_label((string *)&loss_threshold,local_3a8,local_408,200,800);
  std::__cxx11::string::~string((string *)&loss_threshold);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  local_460 = 0.3;
  net._52_4_ = 0x3e99999a;
  net._48_4_ = 2;
  std::__cxx11::string::operator=
            ((string *)
             &net.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"sigmoid");
  cv::Mat::Mat(local_4c0,local_2e8);
  cv::Mat::Mat(local_520,local_348);
  liu::Net::train((Net *)local_250,local_4c0,local_520,local_460,true);
  cv::Mat::~Mat(local_520);
  cv::Mat::~Mat(local_4c0);
  liu::Net::test((Net *)local_250,local_3a8,local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"models/model_sigmoid_800_200_test.xml",&local_541);
  liu::Net::save((Net *)local_250,(string *)local_540);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  getchar();
  cv::Mat::~Mat(local_408);
  cv::Mat::~Mat(local_3a8);
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat(local_2e8);
  liu::Net::~Net((Net *)local_250);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	//Set neuron number of every layer
	vector<int> layer_neuron_num = { 784,100,10 };

	// Initialise Net and weights
	Net net;
	net.initNet(layer_neuron_num);
	net.initWeights(0, 0., 0.01);
	net.initBias(Scalar(0.05));

	//Get test samples and test samples 
	Mat input, label,test_input,test_label;
	int sample_number = 200;
	get_input_label("data/input_label_1000.xml",input, label, sample_number);
	get_input_label("data/input_label_1000.xml", test_input, test_label, 200, 800);

	//Set loss threshold,learning rate and activation function
	float loss_threshold = 0.3;
	net.learning_rate = 0.3;
	net.output_interval = 2;
	net.activation_function = "sigmoid";

	//convert label from 0---1 to -1---1,cause tanh function range is [-1,1]
	//label = 2 * label - 1;

	//Train,and draw the loss curve(cause the last parameter is ture) and test the trained net
	net.train(input, label, loss_threshold,true);
	net.test(test_input, test_label);

	//Save the model
	net.save("models/model_sigmoid_800_200_test.xml");

	getchar();
	return 0;

}